

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O2

void __thiscall
MT32Emu::LA32WaveGenerator::generateNextSample
          (LA32WaveGenerator *this,Bit32u useAmp,Bit16u usePitch,Bit32u useCutoffVal)

{
  Bit16u BVar1;
  Bit32u BVar2;
  uint uVar3;
  LogSample in_RAX;
  LogSample cosineLogSample;
  LogSample local_18;
  
  if (this->active != true) {
    return;
  }
  this->amp = useAmp;
  this->pitch = usePitch;
  if (this->pcmWaveAddress != (Bit16s *)0x0) {
    generateNextPCMWaveLogSamples(this);
    return;
  }
  BVar2 = 0x3c00000;
  if (useCutoffVal < 0x3c00000) {
    BVar2 = useCutoffVal;
  }
  this->cutoffVal = BVar2;
  local_18 = in_RAX;
  generateNextSquareWaveLogSample(this);
  generateNextResonanceWaveLogSample(this);
  if (this->sawtoothWaveform == true) {
    generateNextSawtoothCosineLogSample(this,&local_18);
    uVar3 = (uint)(this->squareLogSample).logValue + (uint)local_18.logValue;
    BVar1 = (Bit16u)uVar3;
    if (0xfffe < uVar3) {
      BVar1 = 0xffff;
    }
    (this->squareLogSample).logValue = BVar1;
    (this->squareLogSample).sign = (uint)((this->squareLogSample).sign != local_18.sign);
    uVar3 = (uint)(this->resonanceLogSample).logValue + (uint)local_18.logValue;
    BVar1 = (Bit16u)uVar3;
    if (0xfffe < uVar3) {
      BVar1 = 0xffff;
    }
    (this->resonanceLogSample).logValue = BVar1;
    (this->resonanceLogSample).sign = (uint)((this->resonanceLogSample).sign != local_18.sign);
  }
  advancePosition(this);
  return;
}

Assistant:

void LA32WaveGenerator::generateNextSample(const Bit32u useAmp, const Bit16u usePitch, const Bit32u useCutoffVal) {
	if (!active) {
		return;
	}

	amp = useAmp;
	pitch = usePitch;

	if (isPCMWave()) {
		generateNextPCMWaveLogSamples();
		return;
	}

	// The 240 cutoffVal limit was determined via sample analysis (internal Munt capture IDs: glop3, glop4).
	// More research is needed to be sure that this is correct, however.
	cutoffVal = (useCutoffVal > MAX_CUTOFF_VALUE) ? MAX_CUTOFF_VALUE : useCutoffVal;

	generateNextSquareWaveLogSample();
	generateNextResonanceWaveLogSample();
	if (sawtoothWaveform) {
		LogSample cosineLogSample;
		generateNextSawtoothCosineLogSample(cosineLogSample);
		LA32Utilites::addLogSamples(squareLogSample, cosineLogSample);
		LA32Utilites::addLogSamples(resonanceLogSample, cosineLogSample);
	}
	advancePosition();
}